

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yamc_barrier.hpp
# Opt level: O0

__pid_t __thiscall
yamc::barrier<yamc::detail::default_barrier_completion>::wait
          (barrier<yamc::detail::default_barrier_completion> *this,void *__stat_loc)

{
  __pid_t extraout_EAX;
  undefined1 local_28 [8];
  unique_lock<std::mutex> lk;
  arrival_token *arrival_local;
  barrier<yamc::detail::default_barrier_completion> *this_local;
  
  lk._8_8_ = __stat_loc;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_28,&this->mtx_);
  while (this->phase_ <= *(uint *)lk._8_8_) {
    std::condition_variable::wait((unique_lock *)&this->cv_);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_28);
  return extraout_EAX;
}

Assistant:

void wait(arrival_token&& arrival) const
  {
    std::unique_lock<decltype(mtx_)> lk(mtx_);
    while (phase_ <= arrival.phase_) {
      cv_.wait(lk);
    }
  }